

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotBarsEx<ImPlot::GetterXsYs<int>>
               (char *label_id,GetterXsYs<int> *getter,double width)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  bool bVar13;
  ImU32 col;
  ImU32 col_00;
  long lVar14;
  ImDrawList *this;
  int iVar15;
  int iVar16;
  int iVar17;
  ImPlotRange *pIVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ImVec2 b;
  ImVec2 a;
  byte local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar13 = BeginItem(label_id,1);
  pIVar12 = GImPlot;
  if (bVar13) {
    dVar24 = width * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar15 = getter->Count, 0 < iVar15)) {
      piVar7 = getter->Xs;
      piVar8 = getter->Ys;
      iVar17 = getter->Offset;
      iVar2 = getter->Stride;
      pIVar9 = GImPlot->CurrentPlot;
      iVar3 = pIVar9->CurrentYAxis;
      uVar4 = (pIVar9->XAxis).Flags;
      pIVar18 = GImPlot->ExtentsY + iVar3;
      uVar5 = pIVar9->YAxis[iVar3].Flags;
      iVar16 = 0;
      do {
        lVar14 = (long)(((iVar17 + iVar16) % iVar15 + iVar15) % iVar15) * (long)iVar2;
        dVar21 = (double)*(int *)((long)piVar7 + lVar14);
        iVar6 = *(int *)((long)piVar8 + lVar14);
        dVar22 = (double)iVar6;
        dVar23 = dVar21 - dVar24;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar23) < 0x7ff0000000000000) {
LAB_001f3dcf:
            if ((0.0 < dVar23) || ((uVar4 & 0x20) == 0)) {
              dVar10 = (pIVar12->ExtentsX).Min;
              dVar11 = (pIVar12->ExtentsX).Max;
              uVar19 = -(ulong)(dVar23 < dVar10);
              uVar20 = -(ulong)(dVar11 < dVar23);
              (pIVar12->ExtentsX).Min = (double)(~uVar19 & (ulong)dVar10 | (ulong)dVar23 & uVar19);
              (pIVar12->ExtentsX).Max = (double)(~uVar20 & (ulong)dVar11 | (ulong)dVar23 & uVar20);
            }
          }
        }
        else if ((((long)ABS(dVar23) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar3].Range.Min <= dVar22)) &&
                (dVar22 <= pIVar9->YAxis[iVar3].Range.Max)) goto LAB_001f3dcf;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((0 < iVar6) || ((uVar5 & 0x20) == 0)) {
LAB_001f3e48:
            dVar23 = pIVar12->ExtentsY[iVar3].Max;
            uVar19 = -(ulong)(dVar22 < pIVar18->Min);
            uVar20 = -(ulong)(dVar23 < dVar22);
            pIVar18->Min = (double)(~uVar19 & (ulong)pIVar18->Min | (ulong)dVar22 & uVar19);
            pIVar12->ExtentsY[iVar3].Max =
                 (double)(~uVar20 & (ulong)dVar23 | (ulong)dVar22 & uVar20);
          }
        }
        else if ((((pIVar9->XAxis).Range.Min <= dVar23) && (dVar23 <= (pIVar9->XAxis).Range.Max)) &&
                (local_48 = (byte)((uVar5 & 0x20) >> 5), (iVar6 < 1 & local_48) == 0))
        goto LAB_001f3e48;
        dVar21 = dVar21 + dVar24;
        if ((uVar4 >> 10 & 1) == 0) {
          if ((long)ABS(dVar21) < 0x7ff0000000000000) {
LAB_001f3eb1:
            if ((0.0 < dVar21) || ((uVar4 & 0x20) == 0)) {
              dVar22 = (pIVar12->ExtentsX).Min;
              dVar23 = (pIVar12->ExtentsX).Max;
              uVar19 = -(ulong)(dVar21 < dVar22);
              uVar20 = -(ulong)(dVar23 < dVar21);
              (pIVar12->ExtentsX).Min = (double)(~uVar19 & (ulong)dVar22 | (ulong)dVar21 & uVar19);
              (pIVar12->ExtentsX).Max = (double)(~uVar20 & (ulong)dVar23 | (ulong)dVar21 & uVar20);
            }
          }
        }
        else if ((((long)ABS(dVar21) < 0x7ff0000000000000) &&
                 (pIVar9->YAxis[iVar3].Range.Min <= 0.0)) && (0.0 <= pIVar9->YAxis[iVar3].Range.Max)
                ) goto LAB_001f3eb1;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar5 & 0x20) == 0) {
LAB_001f3f20:
            dVar21 = (*pIVar18).Min;
            dVar22 = (*pIVar18).Max;
            pIVar18->Min = (double)(-(ulong)(dVar21 <= 0.0) & (ulong)dVar21);
            pIVar12->ExtentsY[iVar3].Max = (double)(-(ulong)(0.0 <= dVar22) & (ulong)dVar22);
          }
        }
        else if ((((uVar5 & 0x20) == 0) && ((pIVar9->XAxis).Range.Min <= dVar21)) &&
                (dVar21 <= (pIVar9->XAxis).Range.Max)) goto LAB_001f3f20;
        iVar16 = iVar16 + 1;
      } while (iVar15 != iVar16);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar12->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar12->NextItemData).Colors + 1);
    iVar15 = getter->Count;
    if (0 < iVar15) {
      bVar13 = (pIVar12->NextItemData).RenderFill;
      bVar1 = (pIVar12->NextItemData).RenderLine;
      iVar17 = 0;
      do {
        lVar14 = (long)(((getter->Offset + iVar17) % iVar15 + iVar15) % iVar15) *
                 (long)getter->Stride;
        iVar2 = *(int *)((long)getter->Ys + lVar14);
        if (iVar2 != 0) {
          dVar21 = (double)*(int *)((long)getter->Xs + lVar14);
          local_38 = PlotToPixels(dVar21 - dVar24,(double)iVar2,-1);
          local_40 = PlotToPixels(dVar21 + dVar24,0.0,-1);
          if ((pIVar12->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar13 ^ 1U | col != col_00) & bVar1) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar12->NextItemData).LineWeight);
          }
          iVar15 = getter->Count;
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < iVar15);
    }
    pIVar12 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar12->NextItemData);
    pIVar12->PreviousItem = pIVar12->CurrentItem;
    pIVar12->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsEx(const char* label_id, const Getter& getter, double width) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const double half_width = width / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(p.x - half_width, p.y));
                FitPoint(ImPlotPoint(p.x + half_width, 0));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.y == 0)
                continue;
            ImVec2 a = PlotToPixels(p.x - half_width, p.y);
            ImVec2 b = PlotToPixels(p.x + half_width, 0);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}